

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<CLIArguments::Rename,_8UL>::reserve
          (SmallVector<CLIArguments::Rename,_8UL> *this,size_t count)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  Rename *pRVar5;
  undefined8 *puVar6;
  long *plVar7;
  Rename *pRVar8;
  long lVar9;
  ulong uVar10;
  
  if (count < 0x38e38e38e38e38f) {
    uVar4 = this->buffer_capacity;
    if (uVar4 < count) {
      uVar10 = 8;
      if (8 < uVar4) {
        uVar10 = uVar4;
      }
      do {
        uVar4 = uVar10;
        uVar10 = uVar4 * 2;
      } while (uVar4 < count);
      if (uVar4 < 9) {
        pRVar5 = (Rename *)&this->stack_storage;
      }
      else {
        pRVar5 = (Rename *)malloc(uVar4 * 0x48);
        if (pRVar5 == (Rename *)0x0) goto LAB_001d0b41;
      }
      pRVar8 = (this->super_VectorView<CLIArguments::Rename>).ptr;
      if ((pRVar5 != pRVar8) && ((this->super_VectorView<CLIArguments::Rename>).buffer_size != 0)) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          pRVar8 = (this->super_VectorView<CLIArguments::Rename>).ptr;
          pcVar2 = (char *)((long)&(pRVar5->old_name)._M_dataplus._M_p + lVar9);
          *(char **)pcVar2 = pcVar2 + 0x10;
          puVar1 = (undefined8 *)((long)&(pRVar8->old_name)._M_dataplus._M_p + lVar9);
          plVar7 = puVar1 + 2;
          if (plVar7 == (long *)*puVar1) {
            uVar3 = puVar1[3];
            *(long *)(pcVar2 + 0x10) = *plVar7;
            *(undefined8 *)(pcVar2 + 0x18) = uVar3;
          }
          else {
            pcVar2 = (char *)((long)&(pRVar5->old_name)._M_dataplus._M_p + lVar9);
            *(long **)pcVar2 = (long *)*puVar1;
            *(long *)(pcVar2 + 0x10) = *plVar7;
          }
          puVar1 = (undefined8 *)((long)&(pRVar8->old_name)._M_dataplus._M_p + lVar9);
          puVar6 = puVar1 + 6;
          pcVar2 = (pRVar5->new_name).field_2._M_local_buf + lVar9;
          *(undefined8 *)(pcVar2 + -0x28) = puVar1[1];
          *puVar1 = plVar7;
          puVar1[1] = 0;
          *(undefined1 *)(puVar1 + 2) = 0;
          *(char **)(pcVar2 + -0x10) = pcVar2;
          if (puVar6 == (undefined8 *)puVar1[4]) {
            uVar3 = puVar1[7];
            *(undefined8 *)pcVar2 = *puVar6;
            *(undefined8 *)(pcVar2 + 8) = uVar3;
          }
          else {
            *(undefined8 **)((long)&(pRVar5->new_name)._M_dataplus._M_p + lVar9) =
                 (undefined8 *)puVar1[4];
            *(undefined8 *)((long)&(pRVar5->new_name).field_2 + lVar9) = *puVar6;
          }
          *(undefined8 *)((long)&(pRVar5->new_name)._M_string_length + lVar9) =
               *(undefined8 *)((long)&(pRVar8->new_name)._M_string_length + lVar9);
          *(undefined8 **)((long)&(pRVar8->new_name)._M_dataplus._M_p + lVar9) = puVar6;
          *(undefined8 *)((long)&(pRVar8->new_name)._M_string_length + lVar9) = 0;
          (pRVar8->new_name).field_2._M_local_buf[lVar9] = '\0';
          *(undefined4 *)((long)&pRVar5->execution_model + lVar9) =
               *(undefined4 *)((long)&pRVar8->execution_model + lVar9);
          pRVar8 = (this->super_VectorView<CLIArguments::Rename>).ptr;
          pcVar2 = *(char **)((long)&(pRVar8->new_name)._M_dataplus._M_p + lVar9);
          if ((pRVar8->new_name).field_2._M_local_buf + lVar9 != pcVar2) {
            operator_delete(pcVar2);
          }
          puVar1 = (undefined8 *)((long)&(pRVar8->old_name)._M_dataplus._M_p + lVar9);
          puVar6 = (undefined8 *)*puVar1;
          if (puVar1 + 2 != puVar6) {
            operator_delete(puVar6);
          }
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x48;
        } while (uVar10 < (this->super_VectorView<CLIArguments::Rename>).buffer_size);
        pRVar8 = (this->super_VectorView<CLIArguments::Rename>).ptr;
      }
      if (pRVar8 != (Rename *)&this->stack_storage) {
        free(pRVar8);
      }
      (this->super_VectorView<CLIArguments::Rename>).ptr = pRVar5;
      this->buffer_capacity = uVar4;
    }
    return;
  }
LAB_001d0b41:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}